

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  seqDef **ppsVar1;
  ulong *iEnd;
  ulong *puVar2;
  ulong *puVar3;
  int *piVar4;
  BYTE *pBVar5;
  ulong *puVar6;
  undefined8 *puVar7;
  U32 *pUVar8;
  BYTE *pBVar9;
  U32 *pUVar10;
  BYTE *pBVar11;
  bool bVar12;
  uint uVar13;
  undefined8 uVar14;
  char cVar15;
  char cVar16;
  uint uVar17;
  ulong *puVar18;
  size_t sVar19;
  ulong *puVar20;
  seqDef *psVar21;
  long *plVar22;
  ulong *puVar23;
  ulong *puVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  U32 UVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  ulong *puVar34;
  ulong *puVar35;
  BYTE *litEnd_1;
  int iVar36;
  ulong uVar37;
  ulong *puVar38;
  BYTE *pBVar39;
  int iVar40;
  int iVar41;
  ulong uVar42;
  int iVar43;
  BYTE *pBVar44;
  ulong uVar45;
  uint uVar46;
  ulong uVar47;
  U32 UVar48;
  BYTE *litEnd;
  ulong *puVar49;
  ulong uVar50;
  ulong uVar51;
  BYTE *pBVar52;
  BYTE *pInLoopLimit;
  BYTE *base;
  BYTE *litLimit_w_1;
  BYTE *litLimit_w;
  U32 *hashLong;
  U32 *hashSmall;
  ulong *local_110;
  uint local_c8;
  BYTE *local_c0;
  int local_68;
  
  pUVar8 = ms->hashTable;
  iEnd = (ulong *)((long)src + srcSize);
  pBVar9 = (ms->window).base;
  uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar43 = (int)pBVar9;
  iVar36 = (int)iEnd - iVar43;
  uVar31 = (ms->window).lowLimit;
  uVar13 = uVar31;
  if (uVar17 < iVar36 - uVar31) {
    uVar13 = iVar36 - uVar17;
  }
  if (ms->loadedDictEnd != 0) {
    uVar13 = uVar31;
  }
  pUVar10 = ms->chainTable;
  puVar6 = (ulong *)((long)src + (srcSize - 8));
  uVar31 = (ms->window).dictLimit;
  uVar46 = *rep;
  local_c8 = rep[1];
  cVar16 = (char)(ms->cParams).chainLog;
  cVar15 = (char)(ms->cParams).hashLog;
  if (uVar13 < uVar31) {
    local_110 = (ulong *)src;
    if (src < puVar6) {
      pBVar11 = (ms->window).dictBase;
      puVar23 = (ulong *)(pBVar9 + uVar31);
      puVar2 = (ulong *)(pBVar11 + uVar13);
      puVar3 = (ulong *)(pBVar11 + uVar31);
      bVar25 = 0x40 - cVar16;
      bVar26 = 0x20 - cVar16;
      bVar27 = 0x40 - cVar15;
      puVar18 = iEnd + -4;
      ppsVar1 = &seqStore->sequences;
      do {
        uVar47 = (ulong)(mls - 5);
        switch(uVar47) {
        case 0:
          lVar32 = -0x30e4432345000000;
          break;
        case 1:
          lVar32 = -0x30e4432340650000;
          break;
        case 2:
          lVar32 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar50 = *src * -0x30e44323485a9b9d;
          goto LAB_00150666;
        default:
          uVar50 = (ulong)((uint)((int)*src * -0x61c8864f) >> (bVar26 & 0x1f));
          goto LAB_0015066e;
        }
        uVar50 = lVar32 * *src;
LAB_00150666:
        uVar50 = uVar50 >> (bVar25 & 0x3f);
LAB_0015066e:
        uVar17 = pUVar10[uVar50];
        pBVar52 = pBVar9;
        if (uVar17 < uVar31) {
          pBVar52 = pBVar11;
        }
        uVar51 = *src;
        uVar37 = uVar51 * -0x30e44323485a9b9d >> (bVar27 & 0x3f);
        uVar30 = pUVar8[uVar37];
        pBVar39 = pBVar9;
        if (uVar30 < uVar31) {
          pBVar39 = pBVar11;
        }
        UVar48 = (int)src - iVar43;
        UVar28 = UVar48 + 1;
        pUVar8[uVar37] = UVar48;
        uVar29 = UVar28 - uVar46;
        pUVar10[uVar50] = UVar48;
        pBVar44 = pBVar9;
        if (uVar29 < uVar31) {
          pBVar44 = pBVar11;
        }
        if (((uVar29 <= uVar13) || ((uVar31 - 1) - uVar29 < 3)) ||
           (*(int *)(pBVar44 + uVar29) != *(int *)((long)src + 1))) {
          puVar49 = (ulong *)src;
          if ((uVar13 < uVar30) && (puVar38 = (ulong *)(pBVar39 + uVar30), *puVar38 == uVar51)) {
            puVar35 = puVar23;
            puVar20 = iEnd;
            if (uVar30 < uVar31) {
              puVar35 = puVar2;
              puVar20 = puVar3;
            }
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 8),(BYTE *)(puVar38 + 1),(BYTE *)iEnd,
                                (BYTE *)puVar20,(BYTE *)puVar23);
            lVar32 = sVar19 + 8;
            if ((puVar35 < puVar38) && (local_110 < src)) {
              puVar38 = (ulong *)(pBVar39 + uVar30);
              do {
                puVar38 = (ulong *)((long)puVar38 + -1);
                puVar20 = (ulong *)((long)src + -1);
                puVar49 = (ulong *)src;
                if ((*(BYTE *)puVar20 != *(BYTE *)puVar38) ||
                   (lVar32 = lVar32 + 1, puVar49 = puVar20, puVar38 <= puVar35)) break;
                src = puVar20;
              } while (local_110 < puVar20);
            }
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar50 = (long)puVar49 - (long)local_110;
                puVar38 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar38 + uVar50) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (iEnd < puVar49) goto LAB_00152162;
                  if (puVar18 < puVar49) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar38,(BYTE *)local_110,(BYTE *)puVar49,(BYTE *)puVar18);
                  }
                  else {
                    uVar51 = local_110[1];
                    *puVar38 = *local_110;
                    puVar38[1] = uVar51;
                    if (0x10 < uVar50) {
                      pBVar52 = seqStore->lit;
                      puVar38 = (ulong *)(pBVar52 + 0x10);
                      puVar20 = local_110 + 2;
                      if (0xffffffffffffffe8 < (ulong)((long)puVar38 + (-8 - (long)puVar20)))
                      goto LAB_001521de;
                      if (0xffffffffffffffe0 < (ulong)((long)puVar38 + (-0x10 - (long)puVar20)))
                      goto LAB_001521fd;
                      uVar51 = local_110[3];
                      *puVar38 = *puVar20;
                      *(ulong *)(pBVar52 + 0x18) = uVar51;
                      if (0x20 < (long)uVar50) {
                        lVar33 = 0;
                        do {
                          puVar7 = (undefined8 *)((long)local_110 + lVar33 + 0x20);
                          uVar14 = puVar7[1];
                          pBVar39 = pBVar52 + lVar33 + 0x20;
                          *(undefined8 *)pBVar39 = *puVar7;
                          *(undefined8 *)(pBVar39 + 8) = uVar14;
                          puVar7 = (undefined8 *)((long)local_110 + lVar33 + 0x30);
                          uVar14 = puVar7[1];
                          *(undefined8 *)(pBVar39 + 0x10) = *puVar7;
                          *(undefined8 *)(pBVar39 + 0x18) = uVar14;
                          lVar33 = lVar33 + 0x20;
                        } while (pBVar39 + 0x20 < pBVar52 + uVar50);
                      }
                    }
                  }
                  seqStore->lit = seqStore->lit + uVar50;
                  if (0xffff < uVar50) {
                    if (seqStore->longLengthID != 0) goto LAB_001521bf;
                    seqStore->longLengthID = 1;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                              >> 3);
                  }
                  uVar30 = UVar48 - uVar30;
                  uVar51 = lVar32 - 3;
                  psVar21 = *ppsVar1;
                  psVar21->litLength = (U16)uVar50;
                  psVar21->offset = uVar30 + 3;
                  local_c8 = uVar46;
                  if (uVar51 < 0x10000) goto LAB_00150f2f;
                  UVar28 = seqStore->longLengthID;
joined_r0x00150d64:
                  if (UVar28 == 0) goto LAB_00150f16;
                  goto LAB_001521a0;
                }
                goto LAB_00152143;
              }
              goto LAB_00152181;
            }
          }
          else {
            if ((uVar17 <= uVar13) ||
               (puVar38 = (ulong *)(pBVar52 + uVar17), (int)*puVar38 != (int)*src)) {
              src = (void *)((long)src + ((long)src - (long)local_110 >> 8) + 1);
              goto LAB_001512d5;
            }
            uVar50 = *(ulong *)((long)src + 1);
            uVar51 = uVar50 * -0x30e44323485a9b9d >> (bVar27 & 0x3f);
            uVar29 = pUVar8[uVar51];
            pBVar39 = pBVar9;
            if (uVar29 < uVar31) {
              pBVar39 = pBVar11;
            }
            pUVar8[uVar51] = UVar28;
            if ((uVar13 < uVar29) && (puVar20 = (ulong *)(pBVar39 + uVar29), *puVar20 == uVar50)) {
              puVar49 = (ulong *)((long)src + 1);
              puVar35 = puVar23;
              puVar38 = iEnd;
              if (uVar29 < uVar31) {
                puVar35 = puVar2;
                puVar38 = puVar3;
              }
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 9),(BYTE *)(puVar20 + 1),(BYTE *)iEnd,
                                  (BYTE *)puVar38,(BYTE *)puVar23);
              lVar32 = sVar19 + 8;
              uVar30 = UVar28 - uVar29;
              if ((puVar35 < puVar20) && (local_110 < puVar49)) {
                puVar38 = (ulong *)(pBVar39 + uVar29);
                while (puVar49 = (ulong *)src, puVar38 = (ulong *)((long)puVar38 + -1),
                      (BYTE)*puVar49 == *(BYTE *)puVar38) {
                  lVar32 = lVar32 + 1;
                  if ((puVar38 <= puVar35) ||
                     (src = (ulong *)((long)puVar49 + -1), puVar49 <= local_110)) goto LAB_00150da5;
                }
                puVar49 = (ulong *)((long)puVar49 + 1);
              }
            }
            else {
              puVar35 = puVar23;
              puVar20 = iEnd;
              if (uVar17 < uVar31) {
                puVar35 = puVar2;
                puVar20 = puVar3;
              }
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)puVar38 + 4),(BYTE *)iEnd,
                                  (BYTE *)puVar20,(BYTE *)puVar23);
              lVar32 = sVar19 + 4;
              uVar30 = UVar48 - uVar17;
              if ((puVar35 < puVar38) && (local_110 < src)) {
                puVar38 = (ulong *)(pBVar52 + uVar17);
                do {
                  puVar38 = (ulong *)((long)puVar38 + -1);
                  puVar20 = (ulong *)((long)puVar49 + -1);
                  if ((*(BYTE *)puVar20 != *(BYTE *)puVar38) ||
                     (lVar32 = lVar32 + 1, puVar49 = puVar20, puVar38 <= puVar35)) break;
                } while (local_110 < puVar20);
              }
            }
LAB_00150da5:
            if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                seqStore->maxNbSeq) {
              if (seqStore->maxNbLit < 0x20001) {
                uVar50 = (long)puVar49 - (long)local_110;
                puVar38 = (ulong *)seqStore->lit;
                if ((BYTE *)((long)puVar38 + uVar50) <= seqStore->litStart + seqStore->maxNbLit) {
                  if (iEnd < puVar49) goto LAB_00152162;
                  if (puVar18 < puVar49) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar38,(BYTE *)local_110,(BYTE *)puVar49,(BYTE *)puVar18);
                  }
                  else {
                    uVar51 = local_110[1];
                    *puVar38 = *local_110;
                    puVar38[1] = uVar51;
                    if (0x10 < uVar50) {
                      pBVar52 = seqStore->lit;
                      puVar38 = (ulong *)(pBVar52 + 0x10);
                      puVar20 = local_110 + 2;
                      if (0xffffffffffffffe8 < (ulong)((long)puVar38 + (-8 - (long)puVar20)))
                      goto LAB_001521de;
                      if (0xffffffffffffffe0 < (ulong)((long)puVar38 + (-0x10 - (long)puVar20)))
                      goto LAB_001521fd;
                      uVar51 = local_110[3];
                      *puVar38 = *puVar20;
                      *(ulong *)(pBVar52 + 0x18) = uVar51;
                      if (0x20 < (long)uVar50) {
                        lVar33 = 0;
                        do {
                          puVar7 = (undefined8 *)((long)local_110 + lVar33 + 0x20);
                          uVar14 = puVar7[1];
                          pBVar39 = pBVar52 + lVar33 + 0x20;
                          *(undefined8 *)pBVar39 = *puVar7;
                          *(undefined8 *)(pBVar39 + 8) = uVar14;
                          puVar7 = (undefined8 *)((long)local_110 + lVar33 + 0x30);
                          uVar14 = puVar7[1];
                          *(undefined8 *)(pBVar39 + 0x10) = *puVar7;
                          *(undefined8 *)(pBVar39 + 0x18) = uVar14;
                          lVar33 = lVar33 + 0x20;
                        } while (pBVar39 + 0x20 < pBVar52 + uVar50);
                      }
                    }
                  }
                  seqStore->lit = seqStore->lit + uVar50;
                  if (0xffff < uVar50) {
                    if (seqStore->longLengthID != 0) goto LAB_001521bf;
                    seqStore->longLengthID = 1;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                              >> 3);
                  }
                  uVar51 = lVar32 - 3;
                  psVar21 = *ppsVar1;
                  psVar21->litLength = (U16)uVar50;
                  psVar21->offset = uVar30 + 3;
                  local_c8 = uVar46;
                  if (0xffff < uVar51) {
                    UVar28 = seqStore->longLengthID;
                    goto joined_r0x00150d64;
                  }
                  goto LAB_00150f2f;
                }
                goto LAB_00152143;
              }
              goto LAB_00152181;
            }
          }
          goto LAB_00152124;
        }
        puVar49 = iEnd;
        if (uVar29 < uVar31) {
          puVar49 = puVar3;
        }
        sVar19 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 5),(BYTE *)((long)(pBVar44 + uVar29) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar49,(BYTE *)puVar23);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00152124;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00152181;
        puVar49 = (ulong *)((long)src + 1);
        uVar50 = (long)puVar49 - (long)local_110;
        puVar38 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar38 + uVar50))
        goto LAB_00152143;
        if (iEnd < puVar49) goto LAB_00152162;
        if (puVar18 < puVar49) {
          ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)local_110,(BYTE *)puVar49,(BYTE *)puVar18);
        }
        else {
          uVar51 = local_110[1];
          *puVar38 = *local_110;
          puVar38[1] = uVar51;
          if (0x10 < uVar50) {
            pBVar52 = seqStore->lit;
            puVar38 = (ulong *)(pBVar52 + 0x10);
            puVar20 = local_110 + 2;
            if (0xffffffffffffffe8 < (ulong)((long)puVar38 + (-8 - (long)puVar20)))
            goto LAB_001521de;
            if (0xffffffffffffffe0 < (ulong)((long)puVar38 + (-0x10 - (long)puVar20)))
            goto LAB_001521fd;
            uVar51 = local_110[3];
            *puVar38 = *puVar20;
            *(ulong *)(pBVar52 + 0x18) = uVar51;
            if (0x20 < (long)uVar50) {
              lVar32 = 0;
              do {
                puVar7 = (undefined8 *)((long)local_110 + lVar32 + 0x20);
                uVar14 = puVar7[1];
                pBVar39 = pBVar52 + lVar32 + 0x20;
                *(undefined8 *)pBVar39 = *puVar7;
                *(undefined8 *)(pBVar39 + 8) = uVar14;
                puVar7 = (undefined8 *)((long)local_110 + lVar32 + 0x30);
                uVar14 = puVar7[1];
                *(undefined8 *)(pBVar39 + 0x10) = *puVar7;
                *(undefined8 *)(pBVar39 + 0x18) = uVar14;
                lVar32 = lVar32 + 0x20;
              } while (pBVar39 + 0x20 < pBVar52 + uVar50);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar50;
        if (0xffff < uVar50) {
          if (seqStore->longLengthID != 0) goto LAB_001521bf;
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        lVar32 = sVar19 + 4;
        uVar51 = sVar19 + 1;
        psVar21 = *ppsVar1;
        psVar21->litLength = (U16)uVar50;
        psVar21->offset = 1;
        uVar30 = uVar46;
        if (0xffff < uVar51) {
          uVar46 = local_c8;
          if (seqStore->longLengthID != 0) goto LAB_001521a0;
LAB_00150f16:
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
          local_c8 = uVar46;
        }
LAB_00150f2f:
        uVar46 = uVar30;
        src = (void *)(lVar32 + (long)puVar49);
        psVar21->matchLength = (U16)uVar51;
        *ppsVar1 = psVar21 + 1;
        local_110 = (ulong *)src;
        if (puVar6 < src) goto LAB_001512d5;
        uVar17 = UVar48 + 2;
        lVar32 = *(long *)(pBVar9 + uVar17);
        uVar50 = lVar32 * -0x30e44323485a9b9d;
        pUVar8[uVar50 >> (bVar27 & 0x3f)] = uVar17;
        pUVar8[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)] =
             ((int)src + -2) - iVar43;
        switch(uVar47) {
        case 0:
          lVar33 = -0x30e4432345000000;
          break;
        case 1:
          lVar33 = -0x30e4432340650000;
          break;
        case 2:
          lVar33 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar50 = uVar50 >> (bVar25 & 0x3f);
          goto LAB_00151038;
        default:
          uVar50 = (ulong)((uint)(*(int *)(pBVar9 + uVar17) * -0x61c8864f) >> (bVar26 & 0x1f));
          goto LAB_00151038;
        }
        uVar50 = (ulong)(lVar32 * lVar33) >> (bVar25 & 0x3f);
LAB_00151038:
        pUVar10[uVar50] = uVar17;
        plVar22 = (long *)((long)src + -1);
        switch(uVar47) {
        case 0:
          lVar32 = -0x30e4432345000000;
          break;
        case 1:
          lVar32 = -0x30e4432340650000;
          break;
        case 2:
          lVar32 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar50 = *plVar22 * -0x30e44323485a9b9d;
          goto LAB_001510bb;
        default:
          uVar50 = (ulong)((uint)(*(int *)plVar22 * -0x61c8864f) >> (bVar26 & 0x1f));
          goto LAB_001510c3;
        }
        uVar50 = lVar32 * *plVar22;
LAB_001510bb:
        uVar50 = uVar50 >> (bVar25 & 0x3f);
LAB_001510c3:
        pUVar10[uVar50] = (int)plVar22 - iVar43;
        do {
          if (puVar6 < src) break;
          UVar28 = (int)src - iVar43;
          uVar17 = UVar28 - local_c8;
          pBVar52 = pBVar9;
          if (uVar17 < uVar31) {
            pBVar52 = pBVar11;
          }
          if (((uVar13 < uVar17) && (2 < (uVar31 - 1) - uVar17)) &&
             (*(int *)(pBVar52 + uVar17) == (int)*src)) {
            puVar49 = iEnd;
            if (uVar17 < uVar31) {
              puVar49 = puVar3;
            }
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar52 + uVar17) + 4),
                                (BYTE *)iEnd,(BYTE *)puVar49,(BYTE *)puVar23);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_00152124;
            if (0x20000 < seqStore->maxNbLit) goto LAB_00152181;
            puVar49 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar49) goto LAB_00152143;
            if (iEnd < local_110) goto LAB_00152162;
            if (puVar18 < local_110) {
              ZSTD_safecopyLiterals
                        ((BYTE *)puVar49,(BYTE *)local_110,(BYTE *)local_110,(BYTE *)puVar18);
            }
            else {
              uVar50 = local_110[1];
              *puVar49 = *local_110;
              puVar49[1] = uVar50;
            }
            psVar21 = seqStore->sequences;
            psVar21->litLength = 0;
            psVar21->offset = 1;
            if (0xffff < sVar19 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_001521a0;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar21->matchLength = (U16)(sVar19 + 1);
            seqStore->sequences = psVar21 + 1;
            if (mls - 5 < 4) {
              sVar19 = (*(code *)(&DAT_0019f118 + *(int *)(&DAT_0019f118 + uVar47 * 4)))();
              return sVar19;
            }
            pUVar10[(uint)((int)*src * -0x61c8864f) >> (bVar26 & 0x1f)] = UVar28;
            pUVar8[*src * -0x30e44323485a9b9d >> (bVar27 & 0x3f)] = UVar28;
            src = (void *)((long)src + sVar19 + 4);
            bVar12 = true;
            local_110 = (ulong *)src;
            uVar17 = local_c8;
            local_c8 = uVar46;
          }
          else {
            bVar12 = false;
            uVar17 = uVar46;
          }
          uVar46 = uVar17;
        } while (bVar12);
LAB_001512d5:
      } while (src < puVar6);
    }
    *rep = uVar46;
  }
  else {
    uVar13 = iVar36 - uVar17;
    if (iVar36 - uVar31 <= uVar17) {
      uVar13 = uVar31;
    }
    pBVar11 = pBVar9 + uVar13;
    puVar23 = (ulong *)((ulong)((int)src == (int)pBVar11) + (long)src);
    uVar17 = (int)puVar23 - (int)pBVar11;
    uVar31 = 0;
    if (uVar17 < local_c8) {
      uVar31 = local_c8;
    }
    if (uVar17 < local_c8) {
      local_c8 = 0;
    }
    pBVar52 = (BYTE *)(ulong)local_c8;
    if (uVar17 < uVar46) {
      uVar31 = uVar46;
    }
    uVar47 = (ulong)uVar46;
    if (uVar17 < uVar46) {
      uVar47 = 0;
    }
    uVar17 = (uint)uVar47;
    if (puVar23 < puVar6) {
      bVar25 = 0x40 - cVar15;
      bVar26 = 0x40 - cVar16;
      bVar27 = 0x20 - cVar16;
      puVar2 = (ulong *)((long)iEnd - 7);
      puVar3 = (ulong *)((long)iEnd - 3);
      puVar18 = (ulong *)((long)iEnd - 1);
      puVar49 = iEnd + -4;
      ppsVar1 = &seqStore->sequences;
      pBVar39 = pBVar9 + -1;
      local_c0 = pBVar39;
LAB_001513b3:
      uVar17 = (uint)uVar47;
      uVar50 = *puVar23;
      uVar37 = uVar50 * -0x30e44323485a9b9d;
      uVar51 = uVar37 >> (bVar25 & 0x3f);
      iVar36 = mls - 5;
      switch(iVar36) {
      case 0:
        lVar32 = -0x30e4432345000000;
        break;
      case 1:
        lVar32 = -0x30e4432340650000;
        break;
      case 2:
        lVar32 = -0x30e44323405a9d00;
        break;
      case 3:
        goto switchD_00151406_caseD_3;
      default:
        uVar37 = (ulong)((uint)((int)*puVar23 * -0x61c8864f) >> (bVar27 & 0x1f));
        goto LAB_0015142d;
      }
      uVar37 = lVar32 * uVar50;
switchD_00151406_caseD_3:
      uVar37 = uVar37 >> (bVar26 & 0x3f);
LAB_0015142d:
      UVar28 = (int)puVar23 - iVar43;
      uVar46 = pUVar8[uVar51];
      uVar30 = pUVar10[uVar37];
      pUVar10[uVar37] = UVar28;
      pUVar8[uVar51] = UVar28;
      puVar38 = (ulong *)((long)puVar23 + 1);
      puVar20 = puVar38;
      if ((uVar17 == 0) || (*(int *)((long)puVar38 - uVar47) != *(int *)((long)puVar23 + 1))) {
        puVar20 = puVar23;
        if ((uVar13 < uVar46) && (puVar35 = (ulong *)(pBVar9 + uVar46), *puVar35 == uVar50)) {
          puVar38 = puVar23 + 1;
          puVar34 = puVar35 + 1;
          puVar24 = puVar38;
          if (puVar38 < puVar2) {
            uVar51 = *puVar38 ^ *puVar34;
            uVar50 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
              }
            }
            pBVar52 = (BYTE *)(uVar50 >> 3 & 0x1fffffff);
            if (*puVar34 == *puVar38) {
              puVar24 = puVar23 + 2;
              puVar34 = puVar35 + 2;
              do {
                if (puVar2 <= puVar24) goto LAB_0015187e;
                uVar50 = *puVar34;
                uVar51 = *puVar24;
                uVar42 = uVar51 ^ uVar50;
                uVar37 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                  }
                }
                pBVar52 = (BYTE *)((long)puVar24 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar38));
                puVar24 = puVar24 + 1;
                puVar34 = puVar34 + 1;
              } while (uVar50 == uVar51);
            }
          }
          else {
LAB_0015187e:
            if ((puVar24 < puVar3) && ((int)*puVar34 == (int)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar34 = (ulong *)((long)puVar34 + 4);
            }
            if ((puVar24 < puVar18) && ((short)*puVar34 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar34 = (ulong *)((long)puVar34 + 2);
            }
            if (puVar24 < iEnd) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar24));
            }
            pBVar52 = (BYTE *)((long)puVar24 - (long)puVar38);
          }
          pBVar52 = pBVar52 + 8;
          local_c0 = (BYTE *)(ulong)(uint)((int)puVar23 - (int)puVar35);
          if ((uVar13 < uVar46) && (src < puVar23)) {
            pBVar44 = pBVar39 + uVar46;
            puVar20 = (ulong *)((long)puVar23 + -1);
            do {
              if ((BYTE)*puVar20 != *pBVar44) goto LAB_00151b25;
              pBVar52 = pBVar52 + 1;
              puVar23 = (ulong *)((long)puVar20 + -1);
            } while ((pBVar11 < pBVar44) &&
                    (pBVar44 = pBVar44 + -1, bVar12 = src < puVar20, puVar20 = puVar23, bVar12));
LAB_0015191e:
            puVar20 = (ulong *)((long)puVar23 + 1);
          }
          goto LAB_00151b2b;
        }
        if ((uVar13 < uVar30) && (piVar4 = (int *)(pBVar9 + uVar30), *piVar4 == (int)*puVar23)) {
          uVar50 = *puVar38;
          uVar51 = uVar50 * -0x30e44323485a9b9d >> (bVar25 & 0x3f);
          uVar46 = pUVar8[uVar51];
          pUVar8[uVar51] = UVar28 + 1;
          iVar41 = 0;
          if ((uVar13 < uVar46) && (puVar35 = (ulong *)(pBVar9 + uVar46), *puVar35 == uVar50)) {
            puVar20 = (ulong *)((long)puVar23 + 9);
            puVar34 = puVar35 + 1;
            puVar24 = puVar20;
            if (puVar20 < puVar2) {
              uVar51 = *puVar20 ^ *puVar34;
              uVar50 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              pBVar52 = (BYTE *)(uVar50 >> 3 & 0x1fffffff);
              if (*puVar34 == *puVar20) {
                puVar24 = (ulong *)((long)puVar23 + 0x11);
                puVar34 = puVar35 + 2;
                do {
                  if (puVar2 <= puVar24) goto LAB_00151929;
                  uVar50 = *puVar34;
                  uVar51 = *puVar24;
                  uVar42 = uVar51 ^ uVar50;
                  uVar37 = 0;
                  if (uVar42 != 0) {
                    for (; (uVar42 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  pBVar52 = (BYTE *)((long)puVar24 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar20));
                  puVar24 = puVar24 + 1;
                  puVar34 = puVar34 + 1;
                } while (uVar50 == uVar51);
              }
            }
            else {
LAB_00151929:
              if ((puVar24 < puVar3) && ((int)*puVar34 == (int)*puVar24)) {
                puVar24 = (ulong *)((long)puVar24 + 4);
                puVar34 = (ulong *)((long)puVar34 + 4);
              }
              if ((puVar24 < puVar18) && ((short)*puVar34 == (short)*puVar24)) {
                puVar24 = (ulong *)((long)puVar24 + 2);
                puVar34 = (ulong *)((long)puVar34 + 2);
              }
              if (puVar24 < iEnd) {
                puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar24));
              }
              pBVar52 = (BYTE *)((long)puVar24 - (long)puVar20);
            }
            pBVar52 = pBVar52 + 8;
            local_68 = (int)puVar35;
            local_c0 = (BYTE *)(ulong)(uint)((int)puVar38 - local_68);
            iVar40 = 7;
            puVar20 = puVar38;
            iVar41 = 7;
            if ((uVar13 < uVar46) && (iVar41 = iVar40, src < puVar38)) {
              pBVar44 = pBVar39 + uVar46;
              while (puVar20 = puVar23, (BYTE)*puVar20 == *pBVar44) {
                pBVar52 = pBVar52 + 1;
                if ((pBVar44 <= pBVar11) ||
                   (pBVar44 = pBVar44 + -1, puVar23 = (ulong *)((long)puVar20 + -1), puVar20 <= src)
                   ) goto LAB_001519f9;
              }
              puVar20 = (ulong *)((long)puVar20 + 1);
            }
          }
LAB_001519f9:
          if (iVar41 != 7) {
            if (iVar41 != 0) goto LAB_00151e43;
            puVar23 = (ulong *)((long)puVar20 + 4);
            puVar35 = (ulong *)(piVar4 + 1);
            puVar38 = puVar23;
            if (puVar23 < puVar2) {
              uVar51 = *puVar23 ^ *puVar35;
              uVar50 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              pBVar52 = (BYTE *)(uVar50 >> 3 & 0x1fffffff);
              if (*puVar35 == *puVar23) {
                puVar38 = (ulong *)((long)puVar20 + 0xc);
                puVar35 = (ulong *)(piVar4 + 3);
                do {
                  if (puVar2 <= puVar38) goto LAB_00151a88;
                  uVar50 = *puVar35;
                  uVar51 = *puVar38;
                  uVar42 = uVar51 ^ uVar50;
                  uVar37 = 0;
                  if (uVar42 != 0) {
                    for (; (uVar42 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  pBVar52 = (BYTE *)((long)puVar38 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar23));
                  puVar38 = puVar38 + 1;
                  puVar35 = puVar35 + 1;
                } while (uVar50 == uVar51);
              }
            }
            else {
LAB_00151a88:
              if ((puVar38 < puVar3) && ((int)*puVar35 == (int)*puVar38)) {
                puVar38 = (ulong *)((long)puVar38 + 4);
                puVar35 = (ulong *)((long)puVar35 + 4);
              }
              if ((puVar38 < puVar18) && ((short)*puVar35 == (short)*puVar38)) {
                puVar38 = (ulong *)((long)puVar38 + 2);
                puVar35 = (ulong *)((long)puVar35 + 2);
              }
              if (puVar38 < iEnd) {
                puVar38 = (ulong *)((long)puVar38 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar38));
              }
              pBVar52 = (BYTE *)((long)puVar38 - (long)puVar23);
            }
            pBVar52 = pBVar52 + 4;
            local_c0 = (BYTE *)(ulong)(uint)((int)puVar20 - (int)piVar4);
            if ((uVar13 < uVar30) && (src < puVar20)) {
              pBVar44 = pBVar39 + uVar30;
              puVar20 = (ulong *)((long)puVar20 + -1);
              do {
                if ((BYTE)*puVar20 != *pBVar44) goto LAB_00151b25;
                pBVar52 = pBVar52 + 1;
                puVar23 = (ulong *)((long)puVar20 + -1);
              } while ((pBVar11 < pBVar44) &&
                      (pBVar44 = pBVar44 + -1, bVar12 = src < puVar20, puVar20 = puVar23, bVar12));
              goto LAB_0015191e;
            }
          }
          goto LAB_00151b2b;
        }
        puVar20 = (ulong *)((long)puVar23 + ((long)puVar23 - (long)src >> 8) + 1);
        goto LAB_00151e43;
      }
      puVar35 = (ulong *)((long)puVar23 + 5);
      puVar34 = (ulong *)((long)puVar23 + (5 - uVar47));
      puVar24 = puVar35;
      if (puVar35 < puVar2) {
        uVar51 = *puVar35 ^ *puVar34;
        uVar50 = 0;
        if (uVar51 != 0) {
          for (; (uVar51 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
          }
        }
        pBVar44 = (BYTE *)(uVar50 >> 3 & 0x1fffffff);
        if (*puVar34 == *puVar35) {
          puVar24 = (ulong *)((long)puVar23 + 0xd);
          puVar34 = (ulong *)((long)puVar23 + (0xd - uVar47));
          do {
            if (puVar2 <= puVar24) goto LAB_001516c6;
            uVar50 = *puVar34;
            uVar51 = *puVar24;
            uVar42 = uVar51 ^ uVar50;
            uVar37 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
              }
            }
            pBVar44 = (BYTE *)((long)puVar24 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar35));
            puVar24 = puVar24 + 1;
            puVar34 = puVar34 + 1;
          } while (uVar50 == uVar51);
        }
      }
      else {
LAB_001516c6:
        if ((puVar24 < puVar3) && ((int)*puVar34 == (int)*puVar24)) {
          puVar24 = (ulong *)((long)puVar24 + 4);
          puVar34 = (ulong *)((long)puVar34 + 4);
        }
        if ((puVar24 < puVar18) && ((short)*puVar34 == (short)*puVar24)) {
          puVar24 = (ulong *)((long)puVar24 + 2);
          puVar34 = (ulong *)((long)puVar34 + 2);
        }
        if (puVar24 < iEnd) {
          puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar24));
        }
        pBVar44 = (BYTE *)((long)puVar24 - (long)puVar35);
      }
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          uVar50 = (long)puVar38 - (long)src;
          puVar23 = (ulong *)seqStore->lit;
          if ((BYTE *)((long)puVar23 + uVar50) <= seqStore->litStart + seqStore->maxNbLit) {
            if (iEnd < puVar38) goto LAB_00152162;
            if (puVar49 < puVar38) {
              ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)src,(BYTE *)puVar38,(BYTE *)puVar49);
            }
            else {
              uVar51 = *(ulong *)((long)src + 8);
              *puVar23 = *src;
              puVar23[1] = uVar51;
              if (0x10 < uVar50) {
                pBVar52 = seqStore->lit;
                puVar23 = (ulong *)(pBVar52 + 0x10);
                puVar38 = (ulong *)((long)src + 0x10);
                if (0xffffffffffffffe8 < (ulong)((long)puVar23 + (-8 - (long)puVar38)))
                goto LAB_001521de;
                if (0xffffffffffffffe0 < (ulong)((long)puVar23 + (-0x10 - (long)puVar38)))
                goto LAB_001521fd;
                uVar51 = *(ulong *)((long)src + 0x18);
                *puVar23 = *puVar38;
                *(ulong *)(pBVar52 + 0x18) = uVar51;
                if (0x20 < (long)uVar50) {
                  lVar32 = 0;
                  do {
                    puVar7 = (undefined8 *)((long)src + lVar32 + 0x20);
                    uVar14 = puVar7[1];
                    pBVar5 = pBVar52 + lVar32 + 0x20;
                    *(undefined8 *)pBVar5 = *puVar7;
                    *(undefined8 *)(pBVar5 + 8) = uVar14;
                    puVar7 = (undefined8 *)((long)src + lVar32 + 0x30);
                    uVar14 = puVar7[1];
                    *(undefined8 *)(pBVar5 + 0x10) = *puVar7;
                    *(undefined8 *)(pBVar5 + 0x18) = uVar14;
                    lVar32 = lVar32 + 0x20;
                  } while (pBVar5 + 0x20 < pBVar52 + uVar50);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar50;
            if (0xffff < uVar50) {
              if (seqStore->longLengthID != 0) goto LAB_001521bf;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            pBVar52 = pBVar44 + 4;
            pBVar44 = pBVar44 + 1;
            psVar21 = *ppsVar1;
            psVar21->litLength = (U16)uVar50;
            psVar21->offset = 1;
            uVar50 = uVar47;
            if (pBVar44 < (BYTE *)0x10000) goto LAB_00151c9b;
            if (seqStore->longLengthID == 0) goto LAB_00151c85;
            goto LAB_001521a0;
          }
          goto LAB_00152143;
        }
        goto LAB_00152181;
      }
      goto LAB_00152124;
    }
LAB_001520cb:
    if (uVar17 == 0) {
      uVar17 = uVar31;
    }
    *rep = uVar17;
    local_110 = (ulong *)src;
    if (local_c8 == 0) {
      local_c8 = uVar31;
    }
  }
  rep[1] = local_c8;
  return (long)iEnd - (long)local_110;
LAB_00151b25:
  puVar20 = (ulong *)((long)puVar20 + 1);
LAB_00151b2b:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_00152124:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2038,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_00152181:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203a,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar50 = (long)puVar20 - (long)src;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar50)) {
LAB_00152143:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (iEnd < puVar20) {
LAB_00152162:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203c,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar49 < puVar20) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)src,(BYTE *)puVar20,(BYTE *)puVar49);
  }
  else {
    uVar51 = *(ulong *)((long)src + 8);
    *puVar23 = *src;
    puVar23[1] = uVar51;
    if (0x10 < uVar50) {
      pBVar44 = seqStore->lit;
      puVar23 = (ulong *)(pBVar44 + 0x10);
      puVar38 = (ulong *)((long)src + 0x10);
      if (0xffffffffffffffe8 < (ulong)((long)puVar23 + (-8 - (long)puVar38))) {
LAB_001521de:
        __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1268,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      if (0xffffffffffffffe0 < (ulong)((long)puVar23 + (-0x10 - (long)puVar38))) {
LAB_001521fd:
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1270,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      uVar51 = *(ulong *)((long)src + 0x18);
      *puVar23 = *puVar38;
      *(ulong *)(pBVar44 + 0x18) = uVar51;
      if (0x20 < (long)uVar50) {
        lVar32 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar32 + 0x20);
          uVar14 = puVar7[1];
          pBVar5 = pBVar44 + lVar32 + 0x20;
          *(undefined8 *)pBVar5 = *puVar7;
          *(undefined8 *)(pBVar5 + 8) = uVar14;
          puVar7 = (undefined8 *)((long)src + lVar32 + 0x30);
          uVar14 = puVar7[1];
          *(undefined8 *)(pBVar5 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar5 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar5 + 0x20 < pBVar44 + uVar50);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar50;
  if (0xffff < uVar50) {
    if (seqStore->longLengthID != 0) {
LAB_001521bf:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x204d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar44 = pBVar52 + -3;
  psVar21 = *ppsVar1;
  psVar21->litLength = (U16)uVar50;
  psVar21->offset = (int)local_c0 + 3;
  if (pBVar44 < (BYTE *)0x10000) {
    uVar50 = (ulong)local_c0 & 0xffffffff;
  }
  else {
    uVar47 = (ulong)local_c0 & 0xffffffff;
    local_c8 = uVar17;
    if (seqStore->longLengthID != 0) {
LAB_001521a0:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2058,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
LAB_00151c85:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
    uVar50 = uVar47;
LAB_00151c9b:
    uVar47 = (ulong)local_c8;
  }
  psVar21->matchLength = (U16)pBVar44;
  *ppsVar1 = psVar21 + 1;
  puVar20 = (ulong *)((long)puVar20 + (long)pBVar52);
  if (puVar6 < puVar20) goto LAB_00151e3b;
  uVar17 = UVar28 + 2;
  lVar32 = *(long *)(pBVar9 + uVar17);
  uVar51 = lVar32 * -0x30e44323485a9b9d;
  pUVar8[uVar51 >> (bVar25 & 0x3f)] = uVar17;
  pUVar8[(ulong)(*(long *)((long)puVar20 + -2) * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] =
       ((int)puVar20 + -2) - iVar43;
  switch(iVar36) {
  case 0:
    lVar33 = -0x30e4432345000000;
    break;
  case 1:
    lVar33 = -0x30e4432340650000;
    break;
  case 2:
    lVar33 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar51 = uVar51 >> (bVar26 & 0x3f);
    goto LAB_00151da1;
  default:
    uVar51 = (ulong)((uint)(*(int *)(pBVar9 + uVar17) * -0x61c8864f) >> (bVar27 & 0x1f));
    goto LAB_00151da1;
  }
  uVar51 = (ulong)(lVar32 * lVar33) >> (bVar26 & 0x3f);
LAB_00151da1:
  pUVar10[uVar51] = uVar17;
  plVar22 = (long *)((long)puVar20 + -1);
  switch(iVar36) {
  case 0:
    lVar32 = -0x30e4432345000000;
    break;
  case 1:
    lVar32 = -0x30e4432340650000;
    break;
  case 2:
    lVar32 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar51 = *plVar22 * -0x30e44323485a9b9d;
    goto LAB_00151e1f;
  default:
    uVar51 = (ulong)((uint)(*(int *)plVar22 * -0x61c8864f) >> (bVar27 & 0x1f));
    goto LAB_00151e27;
  }
  uVar51 = lVar32 * *plVar22;
LAB_00151e1f:
  uVar51 = uVar51 >> (bVar26 & 0x3f);
LAB_00151e27:
  pUVar10[uVar51] = (int)plVar22 - iVar43;
  uVar51 = uVar47;
  if (puVar6 < puVar20) {
LAB_00151e3b:
    local_c8 = (uint)uVar47;
    uVar47 = uVar50;
    src = puVar20;
  }
  else {
    do {
      uVar37 = uVar50;
      local_c8 = (uint)uVar51;
      uVar47 = uVar37;
      src = puVar20;
      if ((local_c8 == 0) || ((int)*puVar20 != *(int *)((long)puVar20 - uVar51))) break;
      puVar23 = (ulong *)((long)puVar20 + 4);
      puVar35 = (ulong *)((long)puVar20 + (4 - uVar51));
      puVar38 = puVar23;
      if (puVar23 < puVar2) {
        uVar50 = *puVar23 ^ *puVar35;
        uVar47 = 0;
        if (uVar50 != 0) {
          for (; (uVar50 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
          }
        }
        pBVar44 = (BYTE *)(uVar47 >> 3 & 0x1fffffff);
        if (*puVar35 == *puVar23) {
          puVar38 = (ulong *)((long)puVar20 + 0xc);
          puVar35 = (ulong *)((long)puVar20 + (0xc - uVar51));
          do {
            if (puVar2 <= puVar38) goto LAB_00151eea;
            uVar47 = *puVar35;
            uVar50 = *puVar38;
            uVar45 = uVar50 ^ uVar47;
            uVar42 = 0;
            if (uVar45 != 0) {
              for (; (uVar45 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
              }
            }
            pBVar44 = (BYTE *)((long)puVar38 + ((uVar42 >> 3 & 0x1fffffff) - (long)puVar23));
            puVar38 = puVar38 + 1;
            puVar35 = puVar35 + 1;
          } while (uVar47 == uVar50);
        }
      }
      else {
LAB_00151eea:
        if ((puVar38 < puVar3) && ((int)*puVar35 == (int)*puVar38)) {
          puVar38 = (ulong *)((long)puVar38 + 4);
          puVar35 = (ulong *)((long)puVar35 + 4);
        }
        if ((puVar38 < puVar18) && ((short)*puVar35 == (short)*puVar38)) {
          puVar38 = (ulong *)((long)puVar38 + 2);
          puVar35 = (ulong *)((long)puVar35 + 2);
        }
        if (puVar38 < iEnd) {
          puVar38 = (ulong *)((long)puVar38 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar38));
        }
        pBVar44 = (BYTE *)((long)puVar38 - (long)puVar23);
      }
      switch(iVar36) {
      case 0:
        lVar32 = -0x30e4432345000000;
        break;
      case 1:
        lVar32 = -0x30e4432340650000;
        break;
      case 2:
        lVar32 = -0x30e44323405a9d00;
        break;
      case 3:
        uVar47 = *puVar20 * -0x30e44323485a9b9d;
        goto LAB_00151f83;
      default:
        uVar47 = (ulong)((uint)((int)*puVar20 * -0x61c8864f) >> (bVar27 & 0x1f));
        goto LAB_00151f8b;
      }
      uVar47 = lVar32 * *puVar20;
LAB_00151f83:
      uVar47 = uVar47 >> (bVar26 & 0x3f);
LAB_00151f8b:
      UVar28 = (int)puVar20 - iVar43;
      pUVar10[uVar47] = UVar28;
      pUVar8[*puVar20 * -0x30e44323485a9b9d >> (bVar25 & 0x3f)] = UVar28;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_00152124;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00152181;
      puVar23 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar23) goto LAB_00152143;
      if (iEnd < puVar20) goto LAB_00152162;
      if (puVar49 < puVar20) {
        ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar20,(BYTE *)puVar20,(BYTE *)puVar49);
      }
      else {
        uVar47 = puVar20[1];
        *puVar23 = *puVar20;
        puVar23[1] = uVar47;
      }
      psVar21 = seqStore->sequences;
      psVar21->litLength = 0;
      psVar21->offset = 1;
      if ((BYTE *)0xffff < pBVar44 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_001521a0;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar21->matchLength = (U16)(pBVar44 + 1);
      seqStore->sequences = psVar21 + 1;
      puVar20 = (ulong *)((long)puVar20 + (long)(pBVar44 + 4));
      uVar50 = uVar51;
      uVar47 = uVar51;
      src = puVar20;
      uVar51 = uVar37;
      local_c8 = (uint)uVar37;
    } while (puVar20 <= puVar6);
  }
LAB_00151e43:
  uVar17 = (uint)uVar47;
  puVar23 = puVar20;
  if (puVar6 <= puVar20) goto LAB_001520cb;
  goto LAB_001513b3;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, mls, ZSTD_noDict);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 current = (U32)(ip-base);
        const U32 repIndex = current + 1 - offset_1;   /* offset_1 expected <= current +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = current;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (repIndex > dictStartIndex))
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, mLength-MINMATCH);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = current - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = current + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = current+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = current - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = current+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (repIndex2 > dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, repLength2-MINMATCH);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}